

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_abstract.c
# Opt level: O0

TA_RetCode TA_GetFuncHandle(char *name,TA_FuncHandle **handle)

{
  uint uVar1;
  TA_FuncDef **ppTVar2;
  TA_FuncDef *pTVar3;
  char cVar4;
  int iVar5;
  long *in_RSI;
  char *in_RDI;
  uint funcDefTableSize;
  uint i;
  TA_FuncInfo *funcInfo;
  TA_FuncDef *funcDef;
  TA_FuncDef **funcDefTable;
  char tmp;
  char firstChar;
  uint local_3c;
  TA_RetCode local_4;
  
  if ((in_RDI == (char *)0x0) || (in_RSI == (long *)0x0)) {
    local_4 = TA_BAD_PARAM;
  }
  else {
    *in_RSI = 0;
    if (*in_RDI == '\0') {
      local_4 = TA_BAD_PARAM;
    }
    else {
      iVar5 = tolower((int)*in_RDI);
      cVar4 = (char)iVar5;
      if ((cVar4 < 'a') || ('z' < cVar4)) {
        local_4 = TA_FUNC_NOT_FOUND;
      }
      else {
        ppTVar2 = TA_DEF_Tables[(int)(char)(cVar4 + -0x61)];
        uVar1 = *TA_DEF_TablesSize[(int)(char)(cVar4 + -0x61)];
        if (uVar1 == 0) {
          local_4 = TA_FUNC_NOT_FOUND;
        }
        else {
          for (local_3c = 0; local_3c < uVar1; local_3c = local_3c + 1) {
            pTVar3 = ppTVar2[local_3c];
            if ((pTVar3 == (TA_FuncDef *)0x0) || (pTVar3->funcInfo == (TA_FuncInfo *)0x0)) {
              return TA_INTERNAL_ERROR|TA_ALLOC_ERR;
            }
            if (pTVar3->funcInfo == (TA_FuncInfo *)0x0) {
              return TA_INTERNAL_ERROR|TA_GROUP_NOT_FOUND;
            }
            iVar5 = strcmp(pTVar3->funcInfo->name,in_RDI);
            if (iVar5 == 0) {
              *in_RSI = (long)pTVar3;
              return TA_SUCCESS;
            }
          }
          local_4 = TA_FUNC_NOT_FOUND;
        }
      }
    }
  }
  return local_4;
}

Assistant:

TA_RetCode TA_GetFuncHandle( const char *name, const TA_FuncHandle **handle )
{
   char firstChar, tmp;
   const TA_FuncDef **funcDefTable;
   const TA_FuncDef *funcDef;
   const TA_FuncInfo *funcInfo;
   unsigned int i, funcDefTableSize;

   /* A TA_FuncHandle is internally a TA_FuncDef. Let's find it
    * by using the alphabetical tables.
    */
   if( (name == NULL) || (handle == NULL) )
   {
      return TA_BAD_PARAM;
   }

   *handle = NULL;

   firstChar = name[0];

   if( firstChar == '\0' )
   {
      return TA_BAD_PARAM;
   }

   tmp = (char)tolower( firstChar );

   if( (tmp < 'a') || (tmp > 'z') )
   {
      return TA_FUNC_NOT_FOUND;
   }

   /* Identify the table. */
   tmp -= (char)'a';
   funcDefTable = TA_DEF_Tables[(int)tmp];

   /* Identify the table size. */
   funcDefTableSize = *TA_DEF_TablesSize[(int)tmp];
   if( funcDefTableSize < 1 )
   {
      return TA_FUNC_NOT_FOUND;
   }

   /* Iterate all entries of the table and return as soon as found. */
   for( i=0; i < funcDefTableSize; i++ )
   {
      funcDef = funcDefTable[i];
      if( !funcDef || !funcDef->funcInfo )
         return TA_INTERNAL_ERROR(3);

      funcInfo = funcDef->funcInfo;
      if( !funcInfo )
         return TA_INTERNAL_ERROR(4);

      if( strcmp( funcInfo->name, name ) == 0 )
      {
         *handle = (TA_FuncHandle *)funcDef;
         return TA_SUCCESS;
      }
   }

   return TA_FUNC_NOT_FOUND;
}